

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O0

void __thiscall Turn::Turn(Turn *this,int day,string *skill,ShiftType *shiftType)

{
  uint uVar1;
  ShiftType *shiftType_local;
  string *skill_local;
  int day_local;
  Turn *this_local;
  
  std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::vector(&this->nurses);
  this->shiftType = shiftType;
  std::__cxx11::string::string((string *)&this->skill,(string *)skill);
  this->day = day;
  uVar1 = CURRENT_ID + 1;
  this->id = CURRENT_ID;
  CURRENT_ID = uVar1;
  return;
}

Assistant:

Turn::Turn(const int day, const string &skill, const ShiftType *shiftType) : day(day), shiftType(shiftType), skill(skill) {
    id = CURRENT_ID++;
}